

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ConstraintBlockSyntax *pCVar4;
  byte bVar5;
  byte bVar6;
  Token openBrace;
  Token TVar7;
  Token closeBrace;
  ConstraintItemSyntax *member;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  Token local_b0;
  Info *local_a0;
  undefined8 local_98;
  SyntaxNode *local_90;
  SyntaxList<slang::syntax::ConstraintItemSyntax> local_88;
  
  Token::Token(&local_b0);
  TVar7 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  psVar1 = &local_88.super_SyntaxListBase.childCount;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = AlwaysBlock;
  local_88.super_SyntaxListBase.super_SyntaxNode._12_4_ = 0;
  bVar5 = 0;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)psVar1;
  do {
    local_a0 = TVar7.info;
    local_98 = TVar7._0_8_;
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = false;
    if ((TVar7.kind != EndOfFile) && (TVar7.kind != CloseBrace)) {
      local_90 = &parseConstraintItem(this,false,isTopLevel)->super_SyntaxNode;
      if (local_90 == (SyntaxNode *)0x0) {
        bVar6 = ~bVar5;
        bVar5 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar6 & 1) << 0x20 | 0x350005));
      }
      else {
        if (local_90->kind == EmptyMember) {
          slang::syntax::SyntaxNode::as<slang::syntax::EmptyMemberSyntax>(local_90);
        }
        SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
        emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                  ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&local_88,
                   (ConstraintItemSyntax **)&local_90);
        bVar5 = 0;
      }
      bVar2 = true;
    }
    TVar7.info = local_a0;
    TVar7.kind = (undefined2)local_98;
    TVar7._2_1_ = local_98._2_1_;
    TVar7.numFlags.raw = local_98._3_1_;
    TVar7.rawLen = local_98._4_4_;
  } while (bVar2);
  local_b0 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  iVar3 = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::ConstraintItemSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_b0.info);
  local_88.super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.data_ =
       (pointer)CONCAT44(extraout_var,iVar3);
  if (local_88.super_SyntaxListBase._vptr_SyntaxListBase != (_func_int **)psVar1) {
    free(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed2b0;
  openBrace.info = local_a0;
  openBrace.kind = (undefined2)local_98;
  openBrace._2_1_ = local_98._2_1_;
  openBrace.numFlags.raw = local_98._3_1_;
  openBrace.rawLen = local_98._4_4_;
  pCVar4 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,&local_88,local_b0);
  return pCVar4;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}